

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

StackSwitch * __thiscall MixedArena::alloc<wasm::StackSwitch>(MixedArena *this)

{
  StackSwitch *pSVar1;
  
  pSVar1 = (StackSwitch *)allocSpace(this,0x48,8);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)95>).super_Expression._id = StackSwitchId;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)95>).super_Expression.type.id = 0;
  (pSVar1->tag).super_IString.str._M_len = 0;
  (pSVar1->tag).super_IString.str._M_str = (char *)0x0;
  (pSVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pSVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pSVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pSVar1->operands).allocator = this;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }